

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.h
# Opt level: O0

LLVMNode * __thiscall
dg::DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
          (DependenceGraph<dg::LLVMNode> *this,Value *k)

{
  bool bVar1;
  iterator this_00;
  pointer ppVar2;
  DGParameterPair<dg::LLVMNode> *pDVar3;
  KeyT in_RDI;
  DGParameterPair<dg::LLVMNode> *p;
  iterator it;
  DependenceGraph<dg::LLVMNode> *in_stack_ffffffffffffffd0;
  _Self local_20 [3];
  LLVMNode *local_8;
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
       ::find((map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
               *)in_RDI,(key_type *)0x19b3c8);
  this_00 = std::
            map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
            ::end((map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
                   *)in_RDI);
  bVar1 = std::operator!=(local_20,(_Self *)&stack0xffffffffffffffd8);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator->
                       ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)
                        0x19b401);
    local_8 = ppVar2->second;
  }
  else {
    if (*(size_t *)(in_RDI + 0x28) != 0) {
      pDVar3 = DGParameters<dg::LLVMNode>::find
                         ((DGParameters<dg::LLVMNode> *)this_00._M_node,
                          (KeyT)in_stack_ffffffffffffffd0);
      if (pDVar3 != (DGParameterPair<dg::LLVMNode> *)0x0) {
        return pDVar3->in;
      }
      in_stack_ffffffffffffffd0 = (DependenceGraph<dg::LLVMNode> *)0x0;
    }
    local_8 = getGlobalNode(in_stack_ffffffffffffffd0,in_RDI);
  }
  return local_8;
}

Assistant:

NodeT *_getNode(T k) {
        auto it = nodes.find(k);
        if (it != nodes.end())
            return it->second;

        if (formalParameters) {
            auto p = formalParameters->find(k);
            if (p)
                return p->in;
        }

        return getGlobalNode(k);
    }